

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testobject.cpp
# Opt level: O0

Am_Wrapper * __thiscall Store_Data::Make_Unique(Store_Data *this)

{
  bool bVar1;
  Store_Data *this_local;
  
  bVar1 = Am_Wrapper::Is_Unique(&this->super_Am_Wrapper);
  this_local = this;
  if (!bVar1) {
    Am_Wrapper::Release(&this->super_Am_Wrapper);
    this_local = (Store_Data *)operator_new(0x10);
    Store_Data(this_local,this);
  }
  return &this_local->super_Am_Wrapper;
}

Assistant:

Am_Define_No_Self_Formula(const char *, retstr)
{
  Store_Data *store =
      (Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  data_test = store->datum;
  return "hello";
}